

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O2

Vec_Int_t * Fra_OneHotCompute(Fra_Man_t *p,Fra_Sml_t *pSim)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  int iVar5;
  uint Entry;
  uint Entry_00;
  Aig_Man_t *pAVar6;
  int i;
  int iVar7;
  int iVar8;
  
  pAVar6 = pSim->pAig;
  if (pAVar6 != p->pManAig) {
    __assert_fail("pSim->pAig == p->pManAig",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                  ,0x8d,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
  }
  iVar8 = pAVar6->nObjs[2] - pAVar6->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  iVar5 = 1;
  i = iVar8;
  do {
    if (pAVar6->vCis->nSize <= i) {
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,i);
    iVar1 = Fra_OneHotNodeIsConst(pSim,pObj);
    if (iVar1 == 0) {
      uVar2 = i - iVar8;
      if ((int)uVar2 < 0) {
        __assert_fail("i-nTruePis >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                      ,0x93,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
      }
      iVar7 = iVar5;
      iVar1 = i;
      while( true ) {
        pAVar6 = pSim->pAig;
        if (pAVar6->vCis->nSize <= iVar8 + iVar7) break;
        iVar1 = iVar1 + 1;
        pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,iVar8 + iVar7);
        iVar3 = Fra_OneHotNodeIsConst(pSim,pObj_00);
        if ((iVar3 == 0) && (iVar3 = Fra_OneHotNodesAreEqual(pSim,pObj,pObj_00), iVar3 == 0)) {
          if (iVar7 < 0) {
            __assert_fail("k-nTruePis >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                          ,0x9c,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
          }
          iVar3 = Fra_OneHotNodesAreClause(pSim,pObj,pObj_00,1,1);
          Entry_00 = ~(iVar1 - iVar8);
          Entry = ~uVar2;
          if ((iVar3 == 0) &&
             (iVar3 = Fra_OneHotNodesAreClause(pSim,pObj,pObj_00,0,1), Entry = uVar2 + 1, iVar3 == 0
             )) {
            iVar3 = Fra_OneHotNodesAreClause(pSim,pObj,pObj_00,1,0);
            if (iVar3 == 0) goto LAB_0073ee88;
            Vec_IntPush(p_00,~uVar2);
            Entry_00 = iVar7 + 1;
          }
          else {
            Vec_IntPush(p_00,Entry);
          }
          Vec_IntPush(p_00,Entry_00);
        }
LAB_0073ee88:
        iVar7 = iVar7 + 1;
      }
    }
    else {
      pAVar6 = pSim->pAig;
    }
    i = i + 1;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Fra_OneHotCompute( Fra_Man_t * p, Fra_Sml_t * pSim )
{
    int fSkipConstEqu = 1;
    Vec_Int_t * vOneHots;
    Aig_Obj_t * pObj1, * pObj2;
    int i, k;
    int nTruePis = Aig_ManCiNum(pSim->pAig) - Aig_ManRegNum(pSim->pAig);
    assert( pSim->pAig == p->pManAig );
    vOneHots = Vec_IntAlloc( 100 );
    Aig_ManForEachLoSeq( pSim->pAig, pObj1, i )
    {
        if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj1) )
            continue;
        assert( i-nTruePis >= 0 );
//        Aig_ManForEachLoSeq( pSim->pAig, pObj2, k )
//        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vPis, pObj2, k, Aig_ManCiNum(p)-Aig_ManRegNum(p) )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vCis, pObj2, k, i+1 )
        {
            if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj2) )
                continue;
            if ( fSkipConstEqu && Fra_OneHotNodesAreEqual( pSim, pObj1, pObj2 ) )
                continue;
            assert( k-nTruePis >= 0 );
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 0, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 0) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 0 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 0) );
                continue;
            }
        }
    }
    return vOneHots;
}